

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioCreate(FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  FAudio *unaff_retaddr;
  uint8_t in_stack_ffffffffffffffef;
  
  FAudioCOMConstructEXT((FAudio **)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffef);
  FAudio_Initialize(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20),(FAudioProcessor)in_RDI);
  return 0;
}

Assistant:

uint32_t FAudioCreate(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor
) {
	FAudioCOMConstructEXT(ppFAudio, FAUDIO_TARGET_VERSION);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}